

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O2

void __thiscall ChatWindow::messageReceived(ChatWindow *this,QString *sender,QString *text)

{
  QStandardItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_88 [24];
  QFont boldFont;
  QArrayDataPointer<char16_t> local_48;
  
  local_a8 = 0xffffffffffffffff;
  local_a0 = 0;
  uStack_98 = 0;
  iVar3 = (**(code **)(*(long *)this->m_chatModel + 0x78))(this->m_chatModel,&local_a8);
  bVar2 = operator!=(&this->m_lastUserName,sender);
  if (bVar2) {
    QString::operator=(&this->m_lastUserName,sender);
    QFont::QFont(&boldFont);
    QFont::setWeight((Weight)&boldFont);
    local_a8 = 0xffffffffffffffff;
    local_a0 = 0;
    uStack_98 = 0;
    (**(code **)(*(long *)this->m_chatModel + 0xf8))(this->m_chatModel,iVar3,2);
    pQVar1 = this->m_chatModel;
    (**(code **)(*(long *)pQVar1 + 0x60))(local_88,pQVar1,iVar3,0);
    operator+((QString *)&local_48,sender,(QChar)0x3a);
    QVariant::QVariant((QVariant *)&local_a8,(QString *)&local_48);
    (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_88,&local_a8,2);
    QVariant::~QVariant((QVariant *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    pQVar1 = this->m_chatModel;
    (**(code **)(*(long *)pQVar1 + 0x60))(local_88,pQVar1,iVar3,0);
    QVariant::QVariant((QVariant *)&local_a8,0x81);
    (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_88,&local_a8,7);
    QVariant::~QVariant((QVariant *)&local_a8);
    pQVar1 = this->m_chatModel;
    (**(code **)(*(long *)pQVar1 + 0x60))(local_88,pQVar1,iVar3,0);
    QFont::operator_cast_to_QVariant((QFont *)&local_a8);
    (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_88,&local_a8,6);
    QVariant::~QVariant((QVariant *)&local_a8);
    iVar3 = iVar3 + 1;
    QFont::~QFont(&boldFont);
  }
  else {
    local_a8 = 0xffffffffffffffff;
    local_a0 = 0;
    uStack_98 = 0;
    (**(code **)(*(long *)this->m_chatModel + 0xf8))(this->m_chatModel,iVar3,1);
  }
  pQVar1 = this->m_chatModel;
  (**(code **)(*(long *)pQVar1 + 0x60))(local_88,pQVar1,iVar3,0);
  QVariant::QVariant((QVariant *)&local_a8,text);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_88,&local_a8,2);
  QVariant::~QVariant((QVariant *)&local_a8);
  pQVar1 = this->m_chatModel;
  (**(code **)(*(long *)pQVar1 + 0x60))(local_88,pQVar1,iVar3,0);
  QVariant::QVariant((QVariant *)&local_a8,0x81);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_88,&local_a8,7);
  QVariant::~QVariant((QVariant *)&local_a8);
  QAbstractItemView::scrollToBottom();
  return;
}

Assistant:

void ChatWindow::messageReceived(const QString &sender, const QString &text)
{
    // store the index of the new row to append to the model containing the messages
    int newRow = m_chatModel->rowCount();
    // we display a line containing the username only if it's different from the last username we displayed
    if (m_lastUserName != sender) {
        // store the last displayed username
        m_lastUserName = sender;
        // create a bold default font
        QFont boldFont;
        boldFont.setBold(true);
        // insert 2 row, one for the message and one for the username
        m_chatModel->insertRows(newRow, 2);
        // store the username in the model
        m_chatModel->setData(m_chatModel->index(newRow, 0), sender + QLatin1Char(':'));
        // set the alignment for the username
        m_chatModel->setData(m_chatModel->index(newRow, 0), int(Qt::AlignLeft | Qt::AlignVCenter), Qt::TextAlignmentRole);
        // set the for the username
        m_chatModel->setData(m_chatModel->index(newRow, 0), boldFont, Qt::FontRole);
        ++newRow;
    } else {
        // insert a row for the message
        m_chatModel->insertRow(newRow);
    }
    // store the message in the model
    m_chatModel->setData(m_chatModel->index(newRow, 0), text);
    // set the alignment for the message
    m_chatModel->setData(m_chatModel->index(newRow, 0), int(Qt::AlignLeft | Qt::AlignVCenter), Qt::TextAlignmentRole);
    // scroll the view to display the new message
    ui->chatView->scrollToBottom();
}